

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O2

void __thiscall VulnerabilityToBin::WriteIdxVulnerabilityFile(VulnerabilityToBin *this)

{
  longlong *plVar1;
  pointer pVVar2;
  size_t __size;
  unsigned_long zippedVulnerabilityRowsLength;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zvr;
  
  (this->vIdx_).vulnerability_id = (this->super_ValidateVulnerability).prevVulID_;
  (this->vIdx_).size = (long)this->rowCount_ * 0xc;
  if (this->zip_ == true) {
    zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&zvr,(long)(this->vulnerabilityRows_).
                          super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>.
                          _M_impl.super__Vector_impl_data._M_finish +
                    (0x400 - (long)(this->vulnerabilityRows_).
                                   super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
    __size = (long)zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    compress();
    fwrite(zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__size,1,(FILE *)this->fileOutBin_);
    (this->vIdx_).size = __size;
    (this->vIdx_).original_size = (long)this->rowCount_ * 0xc;
    pVVar2 = (this->vulnerabilityRows_).
             super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->vulnerabilityRows_).
        super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar2) {
      (this->vulnerabilityRows_).
      super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar2;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  fwrite(&this->vIdx_,0x1c,1,(FILE *)this->fileOutIdx_);
  plVar1 = &(this->vIdx_).offset;
  *plVar1 = *plVar1 + (this->vIdx_).size;
  this->rowCount_ = 0;
  return;
}

Assistant:

void VulnerabilityToBin::WriteIdxVulnerabilityFile() {

  vIdx_.vulnerability_id = prevVulID_;
  vIdx_.size = rowCount_ * sizeof(VulnerabilityRow);

  if (zip_) {

    std::vector<unsigned char> zvr;
    zvr.resize(vulnerabilityRows_.size() * sizeof(VulnerabilityRow) + 1024);
    unsigned long zippedVulnerabilityRowsLength = zvr.size();
    compress(&zvr[0], &zippedVulnerabilityRowsLength,
	     (unsigned char*)&vulnerabilityRows_[0],
	     vulnerabilityRows_.size() * sizeof(VulnerabilityRow));
    fwrite((unsigned char*)&zvr[0], zippedVulnerabilityRowsLength, 1,
	   fileOutBin_);

    // Overwrite with actual size of compressed buffer
    vIdx_.size = zippedVulnerabilityRowsLength;

    vIdx_.original_size = rowCount_ * sizeof(VulnerabilityRow);

    vulnerabilityRows_.clear();   // Reset

  }

  fwrite(&vIdx_, sizeof(vIdx_), 1, fileOutIdx_);

  // Set new offset and reset row counter
  vIdx_.offset += vIdx_.size;
  rowCount_ = 0;

}